

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PrefixUnaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrefixUnaryExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3)

{
  Token operatorToken;
  PrefixUnaryExpressionSyntax *this_00;
  
  this_00 = (PrefixUnaryExpressionSyntax *)allocate(this,0x68,8);
  operatorToken.kind = args_1->kind;
  operatorToken._2_1_ = args_1->field_0x2;
  operatorToken.numFlags.raw = (args_1->numFlags).raw;
  operatorToken.rawLen = args_1->rawLen;
  operatorToken.info = args_1->info;
  slang::syntax::PrefixUnaryExpressionSyntax::PrefixUnaryExpressionSyntax
            (this_00,*args,operatorToken,args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }